

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
* __thiscall
RPCHelpMan::GetArgNames_abi_cxx11_
          (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           *__return_storage_ptr__,RPCHelpMan *this)

{
  pointer pRVar1;
  pointer pRVar2;
  RPCArg *inner;
  pointer __args;
  RPCArg *arg;
  pointer __args_00;
  long in_FS_OFFSET;
  bool local_3a;
  bool local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::reserve(__return_storage_ptr__,
            ((long)(this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3) * 0xf83e0f83e0f83e1);
  __args_00 = (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
              super__Vector_impl_data._M_start;
  pRVar1 = (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__args_00 != pRVar1) {
    do {
      if (__args_00->m_type == OBJ_NAMED_PARAMS) {
        pRVar2 = (__args_00->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (__args = (__args_00->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>.
                      _M_impl.super__Vector_impl_data._M_start; __args != pRVar2;
            __args = __args + 1) {
          local_39 = true;
          std::
          vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
          ::emplace_back<std::__cxx11::string_const&,bool>
                    ((vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
                      *)__return_storage_ptr__,&__args->m_names,&local_39);
        }
      }
      local_3a = false;
      std::
      vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
      ::emplace_back<std::__cxx11::string_const&,bool>
                ((vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
                  *)__return_storage_ptr__,&__args_00->m_names,&local_3a);
      __args_00 = __args_00 + 1;
    } while (__args_00 != pRVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<std::pair<std::string, bool>> RPCHelpMan::GetArgNames() const
{
    std::vector<std::pair<std::string, bool>> ret;
    ret.reserve(m_args.size());
    for (const auto& arg : m_args) {
        if (arg.m_type == RPCArg::Type::OBJ_NAMED_PARAMS) {
            for (const auto& inner : arg.m_inner) {
                ret.emplace_back(inner.m_names, /*named_only=*/true);
            }
        }
        ret.emplace_back(arg.m_names, /*named_only=*/false);
    }
    return ret;
}